

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acb.h
# Opt level: O2

int Acb_ObjIsCio(Acb_Ntk_t *p,int i)

{
  int iVar1;
  
  iVar1 = Acb_ObjIsCi(p,i);
  if (iVar1 != 0) {
    return 1;
  }
  iVar1 = Acb_ObjIsCo(p,i);
  return iVar1;
}

Assistant:

static inline int            Acb_ObjIsCio( Acb_Ntk_t * p, int i )                    { return Acb_ObjIsCi(p, i) || Acb_ObjIsCo(p, i);                                                       }